

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BestLiteralSelector.hpp
# Opt level: O0

void __thiscall
Kernel::
CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
::doSelection(CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
              *this,Clause *c,uint eligible)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint n;
  TermList *pTVar4;
  Literal *pLVar5;
  Literal **ppLVar6;
  List<Kernel::Literal_*> *pLVar7;
  Literal **__b;
  int in_EDX;
  Clause *in_RSI;
  uint besti_1;
  uint i;
  LiteralList *mit_1;
  uint selCnt_1;
  Set<Kernel::Literal_*,_Lib::DefaultHash> maxSet;
  LiteralList *mit;
  uint selCnt;
  LiteralList *nextMax;
  uint besti;
  bool allSelected;
  TermList h1;
  TermList h0;
  TermList t1;
  TermList t0;
  Literal *lit;
  Iterator maxIt;
  Literal *singleSelected;
  LiteralList *maximals;
  TermList in_stack_fffffffffffffe78;
  uint s;
  Clause *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe8c;
  undefined1 in_stack_fffffffffffffe8e;
  undefined1 in_stack_fffffffffffffe8f;
  Clause *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
  *in_stack_fffffffffffffea0;
  Literal *lit_00;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  int local_124;
  List<Kernel::Literal_*> *local_120;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  DArray<Kernel::Literal_*> *in_stack_fffffffffffffef0;
  List<Kernel::Literal_*> *local_e8;
  int local_dc;
  List<Kernel::Literal_*> *local_d8;
  uint local_d0;
  TermList local_c0;
  uint64_t local_b8;
  TermList local_b0;
  uint64_t local_a8;
  uint64_t local_a0;
  Term *local_98;
  Iterator local_90;
  Literal *local_88;
  List<Kernel::Literal_*> *local_80;
  Literal local_78 [2];
  int local_14;
  Clause *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::combSup == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::combSup), iVar3 != 0
     )) {
    doSelection::combSup = Shell::Options::combinatorySup(Lib::env);
    in_stack_fffffffffffffecf = doSelection::combSup;
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::combSup);
  }
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::litArr == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::litArr), iVar3 != 0)
     ) {
    Lib::DArray<Kernel::Literal_*>::DArray
              ((DArray<Kernel::Literal_*> *)in_stack_fffffffffffffe90,
               CONCAT17(in_stack_fffffffffffffe8f,
                        CONCAT16(in_stack_fffffffffffffe8e,
                                 CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))));
    __cxa_atexit(Lib::DArray<Kernel::Literal_*>::~DArray,&doSelection::litArr,&__dso_handle);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::litArr);
  }
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads),
     iVar3 != 0)) {
    Lib::Set<unsigned_int,_Lib::DefaultHash>::Set((Set<unsigned_int,_Lib::DefaultHash> *)0x89488b);
    __cxa_atexit(Lib::Set<unsigned_int,_Lib::DefaultHash>::~Set,&doSelection::maxTermHeads,
                 &__dso_handle);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads);
  }
  Lib::Set<unsigned_int,_Lib::DefaultHash>::reset(&doSelection::maxTermHeads);
  Lib::DArray<Kernel::Literal_*>::initFromArray<Kernel::Clause>
            ((DArray<Kernel::Literal_*> *)in_stack_fffffffffffffe90,
             CONCAT17(in_stack_fffffffffffffe8f,
                      CONCAT16(in_stack_fffffffffffffe8e,
                               CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))),
             in_stack_fffffffffffffe80);
  lit_00 = local_78;
  LiteralComparators::
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>
  ::Composite((Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>
               *)in_stack_fffffffffffffe80,
              (Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>
               *)in_stack_fffffffffffffe78._content);
  Lib::DArray<Kernel::Literal*>::
  sortInversed<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
            (in_stack_fffffffffffffef0,
             (Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>
              *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  LiteralComparators::
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>
  ::~Composite((Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>
                *)in_stack_fffffffffffffe80);
  local_80 = (List<Kernel::Literal_*> *)0x0;
  local_88 = (Literal *)0x0;
  if ((doSelection::combSup & 1U) != 0) {
    fillMaximals(in_stack_fffffffffffffea0,
                 (LiteralList **)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (DArray<Kernel::Literal_*> *)in_stack_fffffffffffffe90);
    Lib::List<Kernel::Literal_*>::Iterator::Iterator(&local_90,local_80);
    while (bVar1 = Lib::List<Kernel::Literal_*>::Iterator::hasNext((Iterator *)0x89497a), bVar1) {
      local_98 = &Lib::List<Kernel::Literal_*>::Iterator::next
                            ((Iterator *)in_stack_fffffffffffffe80)->super_Term;
      pTVar4 = Term::nthArgument(local_98,0);
      local_a0 = pTVar4->_content;
      pTVar4 = Term::nthArgument(local_98,1);
      local_a8 = pTVar4->_content;
      local_b8 = local_a0;
      local_b0 = ApplicativeHelper::getHead(in_stack_fffffffffffffe78);
      local_c0 = ApplicativeHelper::getHead(in_stack_fffffffffffffe78);
      bVar1 = TermList::isVar((TermList *)in_stack_fffffffffffffe80);
      if (bVar1) {
        TermList::var(&local_b0);
        Lib::Set<unsigned_int,_Lib::DefaultHash>::insert
                  ((Set<unsigned_int,_Lib::DefaultHash> *)in_stack_fffffffffffffe80,
                   (uint)(in_stack_fffffffffffffe78._content >> 0x20));
      }
      bVar1 = TermList::isVar((TermList *)in_stack_fffffffffffffe80);
      if (bVar1) {
        TermList::var(&local_c0);
        Lib::Set<unsigned_int,_Lib::DefaultHash>::insert
                  ((Set<unsigned_int,_Lib::DefaultHash> *)in_stack_fffffffffffffe80,
                   (uint)(in_stack_fffffffffffffe78._content >> 0x20));
      }
    }
  }
  bVar1 = false;
  Lib::DArray<Kernel::Literal_*>::operator[](&doSelection::litArr,0);
  bVar2 = LiteralSelector::isNegativeForSelection
                    ((LiteralSelector *)in_stack_fffffffffffffe80,
                     (Literal *)in_stack_fffffffffffffe78._content);
  if (bVar2) {
    ppLVar6 = Lib::DArray<Kernel::Literal_*>::operator[](&doSelection::litArr,0);
    local_88 = *ppLVar6;
  }
  else {
    if ((doSelection::combSup & 1U) == 0) {
      fillMaximals(in_stack_fffffffffffffea0,
                   (LiteralList **)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                   (DArray<Kernel::Literal_*> *)in_stack_fffffffffffffe90);
    }
    local_d0 = 0;
    local_d8 = local_80;
    do {
      pLVar5 = Lib::List<Kernel::Literal_*>::head(local_d8);
      ppLVar6 = Lib::DArray<Kernel::Literal_*>::operator[](&doSelection::litArr,(ulong)local_d0);
      if ((pLVar5 == *ppLVar6) &&
         (local_d8 = Lib::List<Kernel::Literal_*>::tail(local_d8),
         local_d8 == (List<Kernel::Literal_*> *)0x0)) goto LAB_00894c5b;
      local_d0 = local_d0 + 1;
      Lib::DArray<Kernel::Literal_*>::operator[](&doSelection::litArr,(ulong)local_d0);
      bVar2 = LiteralSelector::isNegativeForSelection
                        ((LiteralSelector *)in_stack_fffffffffffffe80,
                         (Literal *)in_stack_fffffffffffffe78._content);
    } while (!bVar2);
    ppLVar6 = Lib::DArray<Kernel::Literal_*>::operator[](&doSelection::litArr,(ulong)local_d0);
    local_88 = *ppLVar6;
  }
LAB_00894c5b:
  if ((local_88 == (Literal *)0x0) &&
     (pLVar7 = Lib::List<Kernel::Literal_*>::tail(local_80),
     pLVar7 == (List<Kernel::Literal_*> *)0x0)) {
    local_88 = Lib::List<Kernel::Literal_*>::head(local_80);
  }
  if (local_88 == (Literal *)0x0) {
    local_dc = 0;
    for (local_e8 = local_80; local_e8 != (List<Kernel::Literal_*> *)0x0;
        local_e8 = Lib::List<Kernel::Literal_*>::tail(local_e8)) {
      local_dc = local_dc + 1;
    }
    bVar1 = local_dc == local_14;
  }
  if (bVar1) {
    Clause::setSelected(in_stack_fffffffffffffe80,(uint)(in_stack_fffffffffffffe78._content >> 0x20)
                       );
  }
  else if (local_88 == (Literal *)0x0) {
    if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
         ::doSelection(Kernel::Clause*,unsigned_int)::replaced == '\0') &&
       (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                                     ::doSelection(Kernel::Clause*,unsigned_int)::replaced),
       iVar3 != 0)) {
      Lib::Stack<Kernel::Literal_*>::Stack
                ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe90,
                 CONCAT17(in_stack_fffffffffffffe8f,
                          CONCAT16(in_stack_fffffffffffffe8e,
                                   CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))));
      __cxa_atexit(Lib::Stack<Kernel::Literal_*>::~Stack,&doSelection::replaced,&__dso_handle);
      __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                           ::doSelection(Kernel::Clause*,unsigned_int)::replaced);
    }
    Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::Set
              ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)0x894d90);
    local_124 = 0;
    for (local_120 = local_80; local_120 != (List<Kernel::Literal_*> *)0x0;
        local_120 = Lib::List<Kernel::Literal_*>::tail(local_120)) {
      Lib::List<Kernel::Literal_*>::head(local_120);
      Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::insert
                ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)in_stack_fffffffffffffe90,
                 (Literal *)
                 CONCAT17(in_stack_fffffffffffffe8f,
                          CONCAT16(in_stack_fffffffffffffe8e,
                                   CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))));
    }
    while (local_80 != (List<Kernel::Literal_*> *)0x0) {
      Clause::operator[](local_10,local_124);
      in_stack_fffffffffffffe9f =
           Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::contains
                     ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)
                      CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                      (Literal *)in_stack_fffffffffffffe90);
      if (!(bool)in_stack_fffffffffffffe9f) {
        Clause::operator[](local_10,local_124);
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffe80,
                   (Literal *)in_stack_fffffffffffffe78._content);
      }
      in_stack_fffffffffffffe90 =
           (Clause *)
           Lib::List<Kernel::Literal_*>::pop((List<Kernel::Literal_*> **)in_stack_fffffffffffffe90);
      ppLVar6 = Clause::operator[](local_10,local_124);
      *ppLVar6 = (Literal *)in_stack_fffffffffffffe90;
      local_124 = local_124 + 1;
    }
    while (in_stack_fffffffffffffe8f =
                Lib::Stack<Kernel::Literal_*>::isNonEmpty(&doSelection::replaced),
          (bool)in_stack_fffffffffffffe8f) {
      while( true ) {
        Clause::operator[](local_10,local_124);
        in_stack_fffffffffffffe8e =
             Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::contains
                       ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)
                        CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                        (Literal *)in_stack_fffffffffffffe90);
        if (((in_stack_fffffffffffffe8e ^ 0xff) & 1) == 0) break;
        local_124 = local_124 + 1;
      }
      in_stack_fffffffffffffe80 =
           (Clause *)Lib::Stack<Kernel::Literal_*>::pop(&doSelection::replaced);
      ppLVar6 = Clause::operator[](local_10,local_124);
      *ppLVar6 = (Literal *)in_stack_fffffffffffffe80;
      local_124 = local_124 + 1;
    }
    Clause::setSelected(in_stack_fffffffffffffe80,(uint)(in_stack_fffffffffffffe78._content >> 0x20)
                       );
    Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::~Set
              ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)in_stack_fffffffffffffe80);
  }
  else {
    n = Clause::getLiteralPosition
                  ((Clause *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),lit_00);
    s = (uint)(in_stack_fffffffffffffe78._content >> 0x20);
    if (n != 0) {
      ppLVar6 = Clause::operator[](local_10,0);
      __b = Clause::operator[](local_10,n);
      std::swap<Kernel::Literal*>(ppLVar6,__b);
      s = (uint)((ulong)ppLVar6 >> 0x20);
    }
    Clause::setSelected(in_stack_fffffffffffffe80,s);
  }
  Lib::List<Kernel::Literal_*>::destroy((List<Kernel::Literal_*> *)in_stack_fffffffffffffe90);
  LiteralSelector::ensureSomeColoredSelected
            (in_stack_fffffffffffffe90,
             CONCAT13(in_stack_fffffffffffffe8f,
                      CONCAT12(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c)));
  return;
}

Assistant:

void doSelection(Clause* c, unsigned eligible) override
  {
    ASS_G(eligible, 1); //trivial cases should be taken care of by the base LiteralSelector

    static bool combSup = env.options->combinatorySup();

    static DArray<Literal*> litArr(64);
    static Set<unsigned> maxTermHeads;
    maxTermHeads.reset();
    litArr.initFromArray(eligible,*c);
    litArr.sortInversed(_comp);

    LiteralList* maximals=0;
    Literal* singleSelected=0; //If equals to 0 in the end, all maximal

    if(combSup){ 
      fillMaximals(maximals, litArr); 
      LiteralList::Iterator maxIt(maximals);
      while(maxIt.hasNext()){
        Literal* lit = maxIt.next();
        TermList t0 = *lit->nthArgument(0);
        TermList t1 = *lit->nthArgument(1);
        TermList h0 = ApplicativeHelper::getHead(t0);  
        TermList h1 = ApplicativeHelper::getHead(t1);
        if(h0.isVar()){ maxTermHeads.insert(h0.var()); }
        if(h1.isVar()){ maxTermHeads.insert(h1.var()); }
      }
    }
    //literals will be selected.
    bool allSelected=false;

    if(isNegativeForSelection(litArr[0])) {
      singleSelected=litArr[0];
    } else {
      if(!combSup){ fillMaximals(maximals, litArr); }
      unsigned besti=0;
      LiteralList* nextMax=maximals;
      while(true) {
        if(nextMax->head()==litArr[besti]) {
          nextMax=nextMax->tail();
          if(nextMax==0) {
            break;
          }
        }
        besti++;
        ASS_L(besti,eligible);
        if(isNegativeForSelection(litArr[besti])){
          singleSelected=litArr[besti];
          break;
        }
      }
    }
    if(!singleSelected && !maximals->tail()) {
      //there is only one maximal literal
      singleSelected=maximals->head();
    }
    if(!singleSelected) {
      unsigned selCnt=0;
      for(LiteralList* mit=maximals; mit; mit=mit->tail()) {
        ASS(isPositiveForSelection(mit->head()));
        selCnt++;
      }
      if(selCnt==eligible) {
        allSelected=true;
      }
    }
    if(allSelected) {
      c->setSelected(eligible);
    } else if(!singleSelected) {
      //select multiple maximal literals
      static Stack<Literal*> replaced(16);
      Set<Literal*> maxSet;
      unsigned selCnt=0;

      for(LiteralList* mit=maximals; mit; mit=mit->tail()) {
        maxSet.insert(mit->head());
      }

      while(maximals) {
        if(!maxSet.contains((*c)[selCnt])) {
          replaced.push((*c)[selCnt]);
        }
        (*c)[selCnt]=LiteralList::pop(maximals);
        selCnt++;
      }
      ASS_G(selCnt,1);
      ASS_LE(selCnt,eligible);

      //put back non-selected literals that were removed
      unsigned i=selCnt;
      while(replaced.isNonEmpty()) {
        while(!maxSet.contains((*c)[i])) {
          i++;
          ASS_L(i,eligible);
        }
        (*c)[i++]=replaced.pop();
      }

      c->setSelected(selCnt);
    } else {
      unsigned besti=c->getLiteralPosition(singleSelected);
      if(besti!=0) {
        std::swap((*c)[0],(*c)[besti]);
      }
      c->setSelected(1);
    }
    LiteralList::destroy(maximals);

    ensureSomeColoredSelected(c, eligible);
  }